

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker>::CommsBroker
          (CommsBroker<helics::tcp::TcpComms,_helics::CoreBroker> *this,string_view obj_name)

{
  undefined8 *in_RDI;
  CoreBroker *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  __integral_type_conflict in_stack_ffffffffffffffac;
  undefined1 __i;
  atomic<int> *in_stack_ffffffffffffffb0;
  unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *this_00;
  
  CoreBroker::CoreBroker(in_stack_00000060,(string_view)in_stack_00000068);
  *in_RDI = &PTR__CommsBroker_00a4fc40;
  in_RDI[1] = &PTR__CommsBroker_00a4fd98;
  std::atomic<int>::atomic(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  __i = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  this_00 = (unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
            (in_RDI + 0x1cf);
  std::unique_ptr<helics::tcp::TcpComms,std::default_delete<helics::tcp::TcpComms>>::
  unique_ptr<std::default_delete<helics::tcp::TcpComms>,void>(this_00);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)__i);
  loadComms(this);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(std::string_view obj_name): BrokerT(obj_name)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}